

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O3

int mp_mul_2d(mp_int *a,int b,mp_int *c)

{
  mp_digit *pmVar1;
  int iVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  
  if ((a != c) && (iVar2 = mp_copy(a,c), iVar2 != 0)) {
    return iVar2;
  }
  iVar2 = c->used + b / 0x3c;
  if ((c->alloc <= iVar2) && (iVar2 = mp_grow(c,iVar2 + 1), iVar2 != 0)) {
    return iVar2;
  }
  if ((0x3b < b) && (iVar2 = mp_lshd(c,b / 0x3c), iVar2 != 0)) {
    return iVar2;
  }
  if (b % 0x3c == 0) {
    uVar5 = (ulong)(uint)c->used;
LAB_00104549:
    uVar4 = (uint)uVar5;
    if (0 < (int)uVar4) {
      do {
        iVar2 = (int)uVar5;
        if (c->dp[uVar5 - 1] != 0) {
          return 0;
        }
        uVar4 = iVar2 - 1;
        c->used = uVar4;
        uVar5 = (ulong)uVar4;
      } while (1 < iVar2);
      goto LAB_0010456d;
    }
  }
  else {
    bVar3 = (byte)(b % 0x3c);
    uVar4 = c->used;
    uVar5 = (ulong)uVar4;
    if (0 < (int)uVar4) {
      pmVar1 = c->dp;
      lVar6 = 0;
      uVar7 = 0;
      do {
        uVar8 = pmVar1[lVar6] >> (0x3c - bVar3 & 0x3f) & ~(-1L << (bVar3 & 0x3f));
        pmVar1[lVar6] = (pmVar1[lVar6] << (bVar3 & 0x3f) | uVar7) & 0xfffffffffffffff;
        lVar6 = lVar6 + 1;
        uVar7 = uVar8;
      } while (uVar4 != (uint)lVar6);
      if (uVar8 != 0) {
        c->used = uVar4 + 1;
        pmVar1[uVar5] = uVar8;
        uVar5 = (ulong)(uVar4 + 1);
      }
      goto LAB_00104549;
    }
  }
  if (uVar4 != 0) {
    return 0;
  }
LAB_0010456d:
  c->sign = 0;
  return 0;
}

Assistant:

int mp_mul_2d (mp_int * a, int b, mp_int * c)
{
  mp_digit d;
  int      res;

  /* copy */
  if (a != c) {
     if ((res = mp_copy (a, c)) != MP_OKAY) {
       return res;
     }
  }

  if (c->alloc < (int)(c->used + b/DIGIT_BIT + 1)) {
     if ((res = mp_grow (c, c->used + b / DIGIT_BIT + 1)) != MP_OKAY) {
       return res;
     }
  }

  /* shift by as many digits in the bit count */
  if (b >= (int)DIGIT_BIT) {
    if ((res = mp_lshd (c, b / DIGIT_BIT)) != MP_OKAY) {
      return res;
    }
  }

  /* shift any bit count < DIGIT_BIT */
  d = (mp_digit) (b % DIGIT_BIT);
  if (d != 0) {
    register mp_digit *tmpc, shift, mask, r, rr;
    register int x;

    /* bitmask for carries */
    mask = (((mp_digit)1) << d) - 1;

    /* shift for msbs */
    shift = DIGIT_BIT - d;

    /* alias */
    tmpc = c->dp;

    /* carry */
    r    = 0;
    for (x = 0; x < c->used; x++) {
      /* get the higher bits of the current word */
      rr = (*tmpc >> shift) & mask;

      /* shift the current word and OR in the carry */
      *tmpc = ((*tmpc << d) | r) & MP_MASK;
      ++tmpc;

      /* set the carry to the carry bits of the current word */
      r = rr;
    }
    
    /* set final carry */
    if (r != 0) {
       c->dp[(c->used)++] = r;
    }
  }
  mp_clamp (c);
  return MP_OKAY;
}